

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<void> __thiscall pstore::storage::address_to_pointer(storage *this,address addr)

{
  address in_RDX;
  shared_ptr<void> sVar1;
  storage *this_local;
  address addr_local;
  
  sVar1 = address_to_pointer_impl<pstore::storage,std::shared_ptr<void>>
                    (this,(storage *)addr.a_,in_RDX);
  sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<void>)sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void> address_to_pointer (address const addr) noexcept {
            return address_to_pointer_impl (*this, addr);
        }